

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::TextureVkImpl::InitializeContentOnHost
          (TextureVkImpl *this,TextureData *InitData,TextureFormatAttribs *FmtAttribs,
          VkImageCreateInfo *ImageCI)

{
  TextureDesc *TexDesc;
  VulkanLogicalDevice *this_00;
  ulong uVar1;
  COMPONENT_TYPE ComponentType;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  VkImageLayout VVar5;
  RESOURCE_STATE RVar6;
  RenderDeviceVkImpl *pRVar7;
  uint uVar8;
  VkImageCreateInfo *pVVar9;
  uint uVar10;
  bool bVar11;
  Uint32 MipLevel;
  pointer pVVar12;
  uint uVar13;
  TextureSubResData *pTVar14;
  char (*in_stack_ffffffffffffff18) [45];
  Uint32 subres;
  VkImageAspectFlags local_dc;
  VkImageCreateInfo *local_d8;
  Uint32 PixelSize;
  Uint32 ExpectedNumSubresources;
  string msg;
  vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> vkCopyRegions;
  string _msg;
  
  pVVar9 = ImageCI;
  pRVar7 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = (pRVar7->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_d8 = ImageCI;
  if ((this_00->m_EnabledExtFeatures).HostImageCopy.hostImageCopy == 0) {
    FormatString<char[26],char[66]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy",
               (char (*) [66])pVVar9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pVVar9 = local_d8;
  ExpectedNumSubresources = local_d8->arrayLayers * local_d8->mipLevels;
  if (InitData->NumSubresources != ExpectedNumSubresources) {
    LogError<true,char[48],unsigned_int,char[18],unsigned_int,char[10]>
              (false,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14f,(char (*) [48])"Incorrect number of subresources in init data. ",
               &ExpectedNumSubresources,(char (*) [18])" expected, while ",
               &InitData->NumSubresources,(char (*) [10])0x6c6fd0);
  }
  ComponentType = FmtAttribs->ComponentType;
  if (ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[63]>
              (&msg,(char (*) [63])"Initializing depth-stencil texture is currently not supported.")
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x151);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    ComponentType = FmtAttribs->ComponentType;
    pVVar9 = local_d8;
  }
  local_dc = ComponentTypeToVkAspectMask(ComponentType);
  std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::vector
            (&vkCopyRegions,(ulong)InitData->NumSubresources,(allocator_type *)&msg);
  subres = 0;
  uVar8 = pVVar9->arrayLayers;
  if (uVar8 != 0) {
    TexDesc = &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               .m_Desc;
    uVar10 = pVVar9->mipLevels;
    uVar4 = 0;
    uVar13 = 0;
    do {
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        MipLevel = 0;
        do {
          pTVar14 = InitData->pSubResources + uVar4;
          pVVar12 = vkCopyRegions.
                    super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar4;
          GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,MipLevel);
          pVVar12->sType = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY;
          pVVar12->pNext = (void *)0x0;
          pVVar12->pHostPointer = pTVar14->pData;
          bVar2 = FmtAttribs->NumComponents;
          if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
            bVar2 = 1;
          }
          PixelSize = (uint)bVar2 * (uint)FmtAttribs->ComponentSize;
          uVar1 = pTVar14->Stride;
          uVar3 = (uint32_t)(uVar1 / PixelSize);
          if (uVar1 % (ulong)PixelSize != 0) {
            FormatString<char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
                      (&_msg,(Diligent *)"Unable to initialize texture \'",(char (*) [31])TexDesc,
                       (char **)"\' on host: subresource ",(char (*) [24])&subres,
                       (uint *)" has stride ",(char (*) [13])&pTVar14->Stride,
                       (unsigned_long *)" that is not multiple of pixel size ",
                       (char (*) [37])&PixelSize,
                       (uint *)". The content will be initialized on device.",
                       in_stack_ffffffffffffff18);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
            }
LAB_00267369:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_msg._M_dataplus._M_p != &_msg.field_2) {
              operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
            }
            bVar11 = false;
            goto LAB_0026738c;
          }
          if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
            uVar3 = (uint32_t)((FmtAttribs->BlockWidth * uVar1) / (ulong)FmtAttribs->ComponentSize);
          }
          pVVar12->memoryRowLength = uVar3;
          if (pTVar14->DepthStride % uVar1 != 0) {
            FormatString<char[31],char_const*,char[24],unsigned_int,char[19],unsigned_long,char[37],unsigned_long,char[45]>
                      (&_msg,(Diligent *)"Unable to initialize texture \'",(char (*) [31])TexDesc,
                       (char **)"\' on host: subresource ",(char (*) [24])&subres,
                       (uint *)" has depth stride ",(char (*) [19])&pTVar14->DepthStride,
                       (unsigned_long *)" that is not multiple of row stride ",
                       (char (*) [37])&pTVar14->Stride,
                       (unsigned_long *)". The content will be initialized on device.",
                       in_stack_ffffffffffffff18);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
            }
            goto LAB_00267369;
          }
          pVVar12->memoryImageHeight =
               (uint32_t)((pTVar14->DepthStride * (ulong)FmtAttribs->BlockHeight) / uVar1);
          (pVVar12->imageSubresource).aspectMask = local_dc;
          (pVVar12->imageSubresource).mipLevel = MipLevel;
          (pVVar12->imageSubresource).baseArrayLayer = uVar13;
          *(undefined8 *)&(pVVar12->imageSubresource).layerCount = 1;
          (pVVar12->imageOffset).y = 0;
          (pVVar12->imageOffset).z = 0;
          *(pointer *)&pVVar12->imageExtent = msg._M_dataplus._M_p;
          (pVVar12->imageExtent).depth = msg.field_2._M_allocated_capacity._0_4_;
          uVar4 = subres + 1;
          MipLevel = MipLevel + 1;
          uVar10 = local_d8->mipLevels;
          subres = uVar4;
        } while (MipLevel < uVar10);
        uVar8 = local_d8->arrayLayers;
        pVVar9 = local_d8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar8);
  }
  msg._M_string_length = 0;
  msg.field_2._8_8_ = 0;
  msg._M_dataplus._M_p = (pointer)0x3b9ee8b6;
  msg.field_2._M_allocated_capacity = (size_type)(this->m_VulkanImage).m_VkObject;
  VVar5 = anon_unknown_102::VkImageLayoutFromUsage(pVVar9->usage);
  msg.field_2._12_4_ = VVar5;
  VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout
            (this_00,(VkHostImageLayoutTransitionInfoEXT *)&msg);
  _msg._M_string_length = 0;
  _msg._M_dataplus._M_p = (pointer)0x3b9ee8b5;
  _msg.field_2._M_allocated_capacity = 0;
  _msg.field_2._8_8_ = (this->m_VulkanImage).m_VkObject;
  VulkanUtilities::VulkanLogicalDevice::CopyMemoryToImage
            (this_00,(VkCopyMemoryToImageInfoEXT *)&_msg);
  RVar6 = VkImageLayoutToResourceState(ExpectedNumSubresources);
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RVar6;
  bVar11 = true;
LAB_0026738c:
  if (vkCopyRegions.super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkCopyRegions.
                    super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkCopyRegions.
                          super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkCopyRegions.
                          super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool TextureVkImpl::InitializeContentOnHost(const TextureData&          InitData,
                                            const TextureFormatAttribs& FmtAttribs,
                                            const VkImageCreateInfo&    ImageCI) noexcept(false)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    VERIFY_EXPR(LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy);

    Uint32 ExpectedNumSubresources = ImageCI.mipLevels * ImageCI.arrayLayers;
    if (InitData.NumSubresources != ExpectedNumSubresources)
        LOG_ERROR_AND_THROW("Incorrect number of subresources in init data. ", ExpectedNumSubresources, " expected, while ", InitData.NumSubresources, " provided");

    VERIFY(FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL, "Initializing depth-stencil texture is currently not supported.");
    const VkImageAspectFlags aspectMask = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

    std::vector<VkMemoryToImageCopyEXT> vkCopyRegions(InitData.NumSubresources);

    Uint32 subres = 0;
    for (Uint32 layer = 0; layer < ImageCI.arrayLayers; ++layer)
    {
        for (Uint32 mip = 0; mip < ImageCI.mipLevels; ++mip)
        {
            const TextureSubResData& SubResData = InitData.pSubResources[subres];
            VkMemoryToImageCopyEXT&  vkCopyInfo = vkCopyRegions[subres];
            MipLevelProperties       MipInfo    = GetMipLevelProperties(m_Desc, mip);

            vkCopyInfo.sType        = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY_EXT;
            vkCopyInfo.pNext        = nullptr;
            vkCopyInfo.pHostPointer = SubResData.pData;

            const Uint32 PixelSize = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                Uint32{FmtAttribs.ComponentSize} :
                Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
            if ((SubResData.Stride % PixelSize) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has stride ", SubResData.Stride,
                                        " that is not multiple of pixel size ", PixelSize, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryRowLength = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                static_cast<uint32_t>(SubResData.Stride * FmtAttribs.BlockWidth / FmtAttribs.ComponentSize) :
                static_cast<uint32_t>(SubResData.Stride / PixelSize);

            if ((SubResData.DepthStride % SubResData.Stride) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has depth stride ", SubResData.DepthStride,
                                        " that is not multiple of row stride ", SubResData.Stride, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryImageHeight = static_cast<uint32_t>(SubResData.DepthStride * FmtAttribs.BlockHeight / SubResData.Stride);

            vkCopyInfo.imageSubresource.aspectMask     = aspectMask;
            vkCopyInfo.imageSubresource.mipLevel       = mip;
            vkCopyInfo.imageSubresource.baseArrayLayer = layer;
            vkCopyInfo.imageSubresource.layerCount     = 1;

            vkCopyInfo.imageOffset = {0, 0, 0};
            vkCopyInfo.imageExtent = {MipInfo.LogicalWidth, MipInfo.LogicalHeight, MipInfo.Depth};

            ++subres;
        }
    }

    VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo{};
    vkLayoutTransitionInfo.sType     = VK_STRUCTURE_TYPE_HOST_IMAGE_LAYOUT_TRANSITION_INFO_EXT;
    vkLayoutTransitionInfo.image     = m_VulkanImage;
    vkLayoutTransitionInfo.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    vkLayoutTransitionInfo.newLayout = VkImageLayoutFromUsage(ImageCI.usage);

    vkLayoutTransitionInfo.subresourceRange.aspectMask     = aspectMask;
    vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
    vkLayoutTransitionInfo.subresourceRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
    vkLayoutTransitionInfo.subresourceRange.baseMipLevel   = 0;
    vkLayoutTransitionInfo.subresourceRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    LogicalDevice.HostTransitionImageLayout(vkLayoutTransitionInfo);

    VkCopyMemoryToImageInfoEXT vkCopyInfo{};
    vkCopyInfo.sType          = VK_STRUCTURE_TYPE_COPY_MEMORY_TO_IMAGE_INFO_EXT;
    vkCopyInfo.pNext          = nullptr;
    vkCopyInfo.flags          = 0;
    vkCopyInfo.dstImage       = m_VulkanImage;
    vkCopyInfo.dstImageLayout = vkLayoutTransitionInfo.newLayout;
    vkCopyInfo.regionCount    = static_cast<uint32_t>(vkCopyRegions.size());
    vkCopyInfo.pRegions       = vkCopyRegions.data();

    LogicalDevice.CopyMemoryToImage(vkCopyInfo);

    SetState(VkImageLayoutToResourceState(vkCopyInfo.dstImageLayout));

    return true;
}